

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O0

void __thiscall ADynamicLight::LinkLight(ADynamicLight *this)

{
  DVector3 local_60;
  DVector3 local_48;
  TVector2<double> local_30;
  subsector_t *local_20;
  subsector_t *subSec;
  FLightNode *node;
  ADynamicLight *this_local;
  
  for (subSec = (subsector_t *)this->touching_sides; subSec != (subsector_t *)0x0;
      subSec = (subsector_t *)subSec->polys) {
    subSec->render_sector = (sector_t *)0x0;
  }
  for (subSec = (subsector_t *)this->touching_subsectors; subSec != (subsector_t *)0x0;
      subSec = (subsector_t *)subSec->polys) {
    subSec->render_sector = (sector_t *)0x0;
  }
  for (subSec = (subsector_t *)this->touching_sector; subSec != (subsector_t *)0x0;
      subSec = (subsector_t *)subSec->polys) {
    subSec->render_sector = (sector_t *)0x0;
  }
  node = (FLightNode *)this;
  if (0.0 < (this->super_AActor).radius) {
    AActor::Pos(&local_48,&this->super_AActor);
    TVector2<double>::TVector2(&local_30,&local_48);
    local_20 = R_PointInSubsector(&local_30);
    validcount = validcount + 1;
    AActor::Pos(&local_60,&this->super_AActor);
    CollectWithinRadius(this,&local_60,local_20,
                        (float)((this->super_AActor).radius * (this->super_AActor).radius));
  }
  subSec = (subsector_t *)this->touching_sides;
  while (subSec != (subsector_t *)0x0) {
    if (subSec->render_sector == (sector_t *)0x0) {
      subSec = (subsector_t *)DeleteLightNode((FLightNode *)subSec);
    }
    else {
      subSec = (subsector_t *)subSec->polys;
    }
  }
  subSec = (subsector_t *)this->touching_subsectors;
  while (subSec != (subsector_t *)0x0) {
    if (subSec->render_sector == (sector_t *)0x0) {
      subSec = (subsector_t *)DeleteLightNode((FLightNode *)subSec);
    }
    else {
      subSec = (subsector_t *)subSec->polys;
    }
  }
  subSec = (subsector_t *)this->touching_sector;
  while (subSec != (subsector_t *)0x0) {
    if (subSec->render_sector == (sector_t *)0x0) {
      subSec = (subsector_t *)DeleteLightNode((FLightNode *)subSec);
    }
    else {
      subSec = (subsector_t *)subSec->polys;
    }
  }
  return;
}

Assistant:

void ADynamicLight::LinkLight()
{
	// mark the old light nodes
	FLightNode * node;
	
	node = touching_sides;
	while (node)
    {
		node->lightsource = NULL;
		node = node->nextTarget;
    }
	node = touching_subsectors;
	while (node)
    {
		node->lightsource = NULL;
		node = node->nextTarget;
    }
	node = touching_sector;
	while (node)
	{
		node->lightsource = NULL;
		node = node->nextTarget;
	}

	if (radius>0)
	{
		// passing in radius*radius allows us to do a distance check without any calls to sqrt
		subsector_t * subSec = R_PointInSubsector(Pos());
		::validcount++;
		CollectWithinRadius(Pos(), subSec, radius*radius);

	}
		
	// Now delete any nodes that won't be used. These are the ones where
	// m_thing is still NULL.
	
	node = touching_sides;
	while (node)
	{
		if (node->lightsource == NULL)
		{
			node = DeleteLightNode(node);
		}
		else
			node = node->nextTarget;
	}

	node = touching_subsectors;
	while (node)
	{
		if (node->lightsource == NULL)
		{
			node = DeleteLightNode(node);
		}
		else
			node = node->nextTarget;
	}

	node = touching_sector;
	while (node)
	{
		if (node->lightsource == NULL)
		{
			node = DeleteLightNode(node);
		}
		else
			node = node->nextTarget;
	}
}